

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_IsOnCurve_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_IsOnCurve_Test> *this)

{
  ECCurveTest *this_00;
  
  WithParamInterface<int>::parameter_ = &this->parameter_;
  this_00 = (ECCurveTest *)operator_new(0x20);
  anon_unknown.dwarf_4495f9::ECCurveTest::ECCurveTest(this_00);
  (this_00->super_TestWithParam<int>).super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_00683428;
  (this_00->super_TestWithParam<int>).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)&DAT_00683468;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }